

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integer.c
# Opt level: O2

sysbvm_tuple_t sysbvm_integer_parseString(sysbvm_context_t *context,size_t stringSize,char *string)

{
  char cVar1;
  byte bVar2;
  bool bVar3;
  _Bool _Var4;
  sysbvm_tuple_t sVar5;
  sysbvm_tuple_t sVar6;
  int iVar7;
  uint uVar8;
  ulong left;
  sysbvm_tuple_t right;
  sysbvm_tuple_t sVar9;
  
  sVar5 = 1;
  if (stringSize != 0) {
    sVar9 = sVar5;
    if (*string == '-') {
      bVar3 = true;
      goto LAB_0011bbb3;
    }
    if (*string == '+') {
      bVar3 = false;
      goto LAB_0011bbb3;
    }
  }
  bVar3 = false;
  sVar9 = 0;
LAB_0011bbb3:
  bVar2 = 1;
  right = 0xa1;
  do {
    if (stringSize <= sVar9) {
      if (!bVar3) {
        return sVar5;
      }
      sVar5 = sysbvm_integer_negated(context,sVar5);
      return sVar5;
    }
    cVar1 = string[sVar9];
    iVar7 = (int)cVar1;
    if ((byte)(cVar1 - 0x30U) < 10) {
      left = (ulong)(iVar7 * 0x10 - 0x2ff);
      _Var4 = sysbvm_integer_greaterEquals(context,left,right);
      if (_Var4) {
        sysbvm_error("Digit value is beyond the radix.");
      }
      sVar5 = sysbvm_integer_multiply(context,sVar5,right);
      sVar6 = sysbvm_integer_add(context,sVar5,left);
    }
    else {
      if ((bool)((byte)(cVar1 + 0x85U) < 0xe6 | bVar2)) {
        if ((bool)((byte)(cVar1 + 0xa5U) < 0xe6 | bVar2)) {
          sVar6 = sVar5;
          if (cVar1 != '_') {
            if ((bool)(bVar2 & cVar1 == 'r')) {
              bVar2 = 0;
              sVar6 = 1;
              right = sVar5;
            }
            else {
              sysbvm_error("Invalid integer literal.");
            }
          }
          goto LAB_0011bcc3;
        }
        uVar8 = iVar7 * 0x10 - 0x36f;
      }
      else {
        uVar8 = iVar7 * 0x10 - 0x56f;
      }
      _Var4 = sysbvm_integer_greaterEquals(context,(ulong)uVar8,right);
      if (_Var4) {
        sysbvm_error("Digit value is beyond the radix.");
      }
      sVar5 = sysbvm_integer_multiply(context,sVar5,right);
      sVar6 = sysbvm_integer_add(context,sVar5,(ulong)uVar8);
      bVar2 = 0;
    }
LAB_0011bcc3:
    sVar9 = sVar9 + 1;
    sVar5 = sVar6;
  } while( true );
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_integer_parseString(sysbvm_context_t *context, size_t stringSize, const char *string)
{
    size_t index = 0;
    bool isNegative = false;

    // Parse the sign.
    if(index < stringSize)
    {
        if(string[index] == '-')
        {
            isNegative = true;
            ++index;
        }
        else if(string[index] == '+')
        {
            ++index;
        }
    }

    sysbvm_tuple_t result = sysbvm_tuple_integer_encodeSmall(0);
    sysbvm_tuple_t radix = sysbvm_tuple_integer_encodeSmall(10);
    bool canParseRadix = true;
    for(; index < stringSize; ++index)
    {
        char digit = string[index];
        if('0' <= digit && digit <= '9')
        {
            sysbvm_tuple_t digitValue = sysbvm_tuple_integer_encodeSmall(digit - '0');
            if(sysbvm_integer_greaterEquals(context, digitValue, radix))
                sysbvm_error("Digit value is beyond the radix.");

            result = sysbvm_integer_multiply(context, result, radix);
            result = sysbvm_integer_add(context, result, digitValue);
        }
        else if(!canParseRadix && 'a' <= digit && digit <= 'z')
        {
            sysbvm_tuple_t digitValue = sysbvm_tuple_integer_encodeSmall(digit - 'a' + 10);
            if(sysbvm_integer_greaterEquals(context, digitValue, radix))
                sysbvm_error("Digit value is beyond the radix.");
            result = sysbvm_integer_multiply(context, result, radix);
            result = sysbvm_integer_add(context, result, digitValue);
        }
        else if(!canParseRadix && 'A' <= digit && digit <= 'Z')
        {
            sysbvm_tuple_t digitValue = sysbvm_tuple_integer_encodeSmall(digit - 'A' + 10);
            if(sysbvm_integer_greaterEquals(context, digitValue, radix))
                sysbvm_error("Digit value is beyond the radix.");
            result = sysbvm_integer_multiply(context, result, radix);
            result = sysbvm_integer_add(context, result, digitValue);
        }
        else if('_' == digit)
        {
            // Ignore it
        }
        else if(canParseRadix && ('r' == digit || 'r' == digit))
        {
            // We just saw the radix.
            radix = result;
            result = sysbvm_tuple_integer_encodeSmall(0);
            canParseRadix = false;
        }
        else
        {
            sysbvm_error("Invalid integer literal.");
        }
    }

    if(isNegative)
        return sysbvm_integer_negated(context, result);

    return result;
}